

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearlyTransformedCosines.cpp
# Opt level: O2

void __thiscall
arealights::LinearlyTransformedCosines::loadLookupTextures(LinearlyTransformedCosines *this)

{
  Texture *pTVar1;
  _func_int **pp_Var2;
  LinearlyTransformedCosines *pLVar3;
  Writer *pWVar4;
  string *this_00;
  GLenum err;
  uint ltcMatA;
  unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_> lookup_alf;
  uint ltcMatB;
  Writer local_a8;
  LinearlyTransformedCosines *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"../assets/lookups/result_64x64.ltc",(allocator<char> *)&ltcMatA);
  read_alf_file((arealights *)&lookup_alf,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((__uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>)
      lookup_alf._M_t.
      super___uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>._M_t.
      super__Tuple_impl<0UL,_arealights::alf_file_*,_std::default_delete<arealights::alf_file>_>.
      super__Head_base<0UL,_arealights::alf_file_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>)0x0) {
    local_38 = this;
    (*glad_glGenTextures)(1,&ltcMatA);
    (*glad_glGenTextures)(1,&ltcMatB);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glBindTexture)(0xde1,ltcMatA);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
    (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
    (*glad_glTexImage2D)
              (0xde1,0,0x8814,
               *(GLsizei *)
                ((long)lookup_alf._M_t.
                       super___uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_arealights::alf_file_*,_std::default_delete<arealights::alf_file>_>
                       .super__Head_base<0UL,_arealights::alf_file_*,_false>._M_head_impl + 0xc),
               *(GLsizei *)
                ((long)lookup_alf._M_t.
                       super___uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_arealights::alf_file_*,_std::default_delete<arealights::alf_file>_>
                       .super__Head_base<0UL,_arealights::alf_file_*,_false>._M_head_impl + 8),0,
               0x1908,0x1406,
               *(void **)((long)lookup_alf._M_t.
                                super___uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_arealights::alf_file_*,_std::default_delete<arealights::alf_file>_>
                                .super__Head_base<0UL,_arealights::alf_file_*,_false>._M_head_impl +
                         0x10));
    while( true ) {
      err = (*glad_glGetError)();
      if (err == 0) break;
      local_a8._vptr_Writer = (_func_int **)&PTR__Writer_001ea4f0;
      local_a8.m_level = Error;
      local_a8.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/LinearlyTransformedCosines.cpp"
      ;
      local_a8.m_line = 0x91;
      local_a8.m_func = "void arealights::LinearlyTransformedCosines::loadLookupTextures()";
      local_a8.m_verboseLevel = 0;
      local_a8.m_logger = (Logger *)0x0;
      local_a8.m_proceed = false;
      local_a8.m_messageBuilder.m_logger = (Logger *)0x0;
      local_a8.m_messageBuilder.m_containerLogSeperator = "";
      local_a8.m_dispatchAction = NormalLog;
      local_a8.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar4 = el::base::Writer::construct(&local_a8,1,"framework");
      el::base::Writer::operator<<(pWVar4,&err);
      el::base::Writer::~Writer(&local_a8);
    }
    (*glad_glBindTexture)(0xde1,ltcMatB);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
    (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
    (*glad_glTexImage2D)
              (0xde1,0,0x8815,
               *(GLsizei *)
                ((long)lookup_alf._M_t.
                       super___uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_arealights::alf_file_*,_std::default_delete<arealights::alf_file>_>
                       .super__Head_base<0UL,_arealights::alf_file_*,_false>._M_head_impl + 0xc),
               *(GLsizei *)
                ((long)lookup_alf._M_t.
                       super___uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_arealights::alf_file_*,_std::default_delete<arealights::alf_file>_>
                       .super__Head_base<0UL,_arealights::alf_file_*,_false>._M_head_impl + 8),0,
               0x1907,0x1406,
               *(void **)((long)lookup_alf._M_t.
                                super___uniq_ptr_impl<arealights::alf_file,_std::default_delete<arealights::alf_file>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_arealights::alf_file_*,_std::default_delete<arealights::alf_file>_>
                                .super__Head_base<0UL,_arealights::alf_file_*,_false>._M_head_impl +
                         0x28));
    while( true ) {
      err = (*glad_glGetError)();
      if (err == 0) break;
      local_a8._vptr_Writer = (_func_int **)&PTR__Writer_001ea4f0;
      local_a8.m_level = Error;
      local_a8.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/LinearlyTransformedCosines.cpp"
      ;
      local_a8.m_line = 0xa0;
      local_a8.m_func = "void arealights::LinearlyTransformedCosines::loadLookupTextures()";
      local_a8.m_verboseLevel = 0;
      local_a8.m_logger = (Logger *)0x0;
      local_a8.m_proceed = false;
      local_a8.m_messageBuilder.m_logger = (Logger *)0x0;
      local_a8.m_messageBuilder.m_containerLogSeperator = "";
      local_a8.m_dispatchAction = NormalLog;
      local_a8.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar4 = el::base::Writer::construct(&local_a8,1,"framework");
      el::base::Writer::operator<<(pWVar4,&err);
      el::base::Writer::~Writer(&local_a8);
    }
    (*glad_glBindTexture)(0xde1,0);
    std::make_unique<fw::Texture,unsigned_int&>((uint *)&local_a8);
    pLVar3 = local_38;
    pp_Var2 = local_a8._vptr_Writer;
    local_a8._vptr_Writer = (_func_int **)0x0;
    pTVar1 = (local_38->_ltcLookupMatA)._M_t.
             super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
             super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
             super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl;
    (local_38->_ltcLookupMatA)._M_t.
    super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
    super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
    super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl = (Texture *)pp_Var2;
    if (pTVar1 != (Texture *)0x0) {
      (*pTVar1->_vptr_Texture[1])();
      if ((Texture *)local_a8._vptr_Writer != (Texture *)0x0) {
        (*(*(_func_int ***)local_a8._vptr_Writer)[1])();
      }
    }
    std::make_unique<fw::Texture,unsigned_int&>((uint *)&local_a8);
    pp_Var2 = local_a8._vptr_Writer;
    local_a8._vptr_Writer = (_func_int **)0x0;
    pTVar1 = (pLVar3->_ltcLookupMatB)._M_t.
             super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
             super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
             super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl;
    (pLVar3->_ltcLookupMatB)._M_t.
    super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
    super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
    super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl = (Texture *)pp_Var2;
    if (pTVar1 != (Texture *)0x0) {
      (*pTVar1->_vptr_Texture[1])();
      if (local_a8._vptr_Writer != (_func_int **)0x0) {
        (**(code **)(*local_a8._vptr_Writer + 8))();
      }
    }
    std::unique_ptr<arealights::alf_file,_std::default_delete<arealights::alf_file>_>::~unique_ptr
              (&lookup_alf);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,"Cannot load LTC lookup tables.",(allocator<char> *)&local_a8);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void LinearlyTransformedCosines::loadLookupTextures()
{
    auto lookup_alf = read_alf_file("../assets/lookups/result_64x64.ltc");

    if (!lookup_alf) {
        throw std::string("Cannot load LTC lookup tables.");
    }

    unsigned int ltcMatA, ltcMatB;
    glGenTextures(1, &ltcMatA);
    glGenTextures(1, &ltcMatB);

    glActiveTexture(GL_TEXTURE0);

    glBindTexture(GL_TEXTURE_2D, ltcMatA);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F,
        lookup_alf->header.num_samples_roughness, lookup_alf->header.num_samples_angle,
        0, GL_RGBA, GL_FLOAT, lookup_alf->texture_slot1.data());

    GLenum err;
    while((err = glGetError()) != GL_NO_ERROR)
    {
        LOG(ERROR) << err;
    }

    glBindTexture(GL_TEXTURE_2D, ltcMatB);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB32F,
        lookup_alf->header.num_samples_roughness, lookup_alf->header.num_samples_angle,
        0, GL_RGB, GL_FLOAT, lookup_alf->texture_slot2.data());

    while((err = glGetError()) != GL_NO_ERROR)
    {
        LOG(ERROR) << err;
    }

    glBindTexture(GL_TEXTURE_2D, 0);

    _ltcLookupMatA = std::make_unique<fw::Texture>(ltcMatA);
    _ltcLookupMatB = std::make_unique<fw::Texture>(ltcMatB);
}